

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O0

string * __thiscall
libcellml::Generator::GeneratorImpl::generateOneParameterFunctionCode
          (string *__return_storage_ptr__,GeneratorImpl *this,string *function,
          AnalyserEquationAstPtr *ast)

{
  AnalyserEquationAstPtr local_98;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  __shared_ptr_access<libcellml::AnalyserEquationAst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *local_28;
  AnalyserEquationAstPtr *ast_local;
  string *function_local;
  GeneratorImpl *this_local;
  
  local_28 = (__shared_ptr_access<libcellml::AnalyserEquationAst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)ast;
  ast_local = (AnalyserEquationAstPtr *)function;
  function_local = (string *)this;
  this_local = (GeneratorImpl *)__return_storage_ptr__;
  std::operator+(&local_68,function,"(");
  std::__shared_ptr_access<libcellml::AnalyserEquationAst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->(local_28);
  AnalyserEquationAst::leftChild((AnalyserEquationAst *)&local_98);
  generateCode_abi_cxx11_(&local_88,this,&local_98);
  std::operator+(&local_48,&local_68,&local_88);
  std::operator+(__return_storage_ptr__,&local_48,")");
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_88);
  std::shared_ptr<libcellml::AnalyserEquationAst>::~shared_ptr(&local_98);
  std::__cxx11::string::~string((string *)&local_68);
  return __return_storage_ptr__;
}

Assistant:

std::string Generator::GeneratorImpl::generateOneParameterFunctionCode(const std::string &function,
                                                                       const AnalyserEquationAstPtr &ast) const
{
    return function + "(" + generateCode(ast->leftChild()) + ")";
}